

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFAcroFormDocumentHelper::getOrCreateAcroForm(QPDFAcroFormDocumentHelper *this)

{
  QPDFObjectHandle *oh;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  QPDFObjectHandle QVar3;
  allocator<char> local_71;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  QPDF local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  QPDFObjectHandle local_30 [2];
  
  QPDF::getRoot((QPDF *)local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"/AcroForm",(allocator<char> *)local_60);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
  _Var2._M_pi = extraout_RDX;
  if (!bVar1) {
    QPDF::getRoot((QPDF *)local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"/AcroForm",&local_71);
    oh = *(QPDFObjectHandle **)(in_RSI + 8);
    QPDFObjectHandle::newDictionary();
    QPDF::makeIndirectObject(&local_40,oh);
    QPDFObjectHandle::replaceKeyAndGetNew((QPDFObjectHandle *)local_70,(string *)local_60,local_30);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x18));
    std::__cxx11::string::~string((string *)local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    _Var2._M_pi = extraout_RDX_00;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFAcroFormDocumentHelper::getOrCreateAcroForm()
{
    auto acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        acroform = qpdf.getRoot().replaceKeyAndGetNew(
            "/AcroForm", qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary()));
    }
    return acroform;
}